

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plibraryloader-posix.c
# Opt level: O0

pchar * p_library_loader_get_last_error(PLibraryLoader *loader)

{
  pchar *str;
  pchar *msg;
  pchar *res;
  PLibraryLoader *loader_local;
  
  msg = (pchar *)0x0;
  str = (pchar *)dlerror();
  if (str != (pchar *)0x0) {
    msg = p_strdup(str);
  }
  return msg;
}

Assistant:

P_LIB_API pchar *
p_library_loader_get_last_error (PLibraryLoader *loader)
{
	pchar		*res = NULL;
	const pchar	*msg;

	P_UNUSED (loader);

	msg = dlerror ();

	if (msg != NULL)
		res = p_strdup (msg);

	return res;
}